

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CPU.cpp
# Opt level: O3

void __thiscall CPU::SBC_ZP_X(CPU *this)

{
  uint uVar1;
  byte bVar2;
  uint uVar3;
  byte bVar4;
  uint uVar5;
  
  this->cycles = 4;
  bVar4 = this->A;
  uVar1 = (*this->memory->_vptr_MemoryBus[2])(this->memory,(ulong)this->pc);
  this->pc = this->pc + 1;
  this->cycles = this->cycles - 2;
  uVar1 = (*this->memory->_vptr_MemoryBus[2])(this->memory,(ulong)((uint)this->X + (uVar1 & 0xff)));
  uVar3 = (uint)this->A - ((~(uint)(this->field_6).ps & 1) + (uVar1 & 0xff));
  bVar2 = (byte)uVar3;
  this->A = bVar2;
  uVar5 = bVar4 & 0xffffff80;
  bVar4 = ((bVar2 & 0x80) != (byte)uVar5) << 6;
  if ((uVar1 & 0x80) != uVar5) {
    bVar4 = 0;
  }
  (this->field_6).ps =
       (this->field_6).ps & 0x3c | (uVar3 & 0xff00) == 0 | (bVar2 == 0) * '\x02' | bVar4 |
       bVar2 & 0x80;
  return;
}

Assistant:

void CPU::SBC_ZP_X()
{
    cycles = 4;
    uint8_t acp = A, op = ReadByte(GetByte() + X);
    uint16_t sum = A - op - !C;
    A = (sum & 0xFF);
    C = !((sum & 0xFF00) > 0);
    Z = (A == 0);
    N = (A & 0b10000000) > 0;
    V = (((acp & 0b10000000) ^ (op & 0b10000000)) == 0) ? (A & 0b10000000) != (acp & 0b10000000) : 0;
}